

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

void core::image::anon_unknown_7::load_mvei_headers_intern(istream *in,ImageHeaders *headers)

{
  Exception *pEVar1;
  undefined3 local_5b;
  undefined5 uStack_58;
  char signature [11];
  undefined1 local_40 [16];
  int local_30;
  int local_2c;
  int32_t width;
  int32_t height;
  int32_t channels;
  int32_t raw_type;
  
  std::istream::read((char *)in,(long)&local_5b);
  if (CONCAT35(signature._0_3_,uStack_58) != 0xa4547414d495f45 ||
      CONCAT53(uStack_58,local_5b) != 0x414d495f45564d89) {
    pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
    signature._3_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(signature + 3),"Invalid file signature","");
    util::Exception::Exception(pEVar1,(string *)(signature + 3));
    __cxa_throw(pEVar1,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  std::istream::read((char *)in,(long)&local_30);
  std::istream::read((char *)in,(long)&local_2c);
  std::istream::read((char *)in,(long)&width);
  std::istream::read((char *)in,(long)&height);
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    headers->width = local_30;
    headers->height = local_2c;
    headers->channels = width;
    headers->type = height;
    return;
  }
  pEVar1 = (Exception *)__cxa_allocate_exception(0x28);
  signature._3_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(signature + 3),"Error reading headers","");
  util::Exception::Exception(pEVar1,(string *)(signature + 3));
  __cxa_throw(pEVar1,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
    load_mvei_headers_intern (std::istream& in, ImageHeaders* headers)
    {
        char signature[MVEI_FILE_SIGNATURE_LEN];
        in.read(signature, MVEI_FILE_SIGNATURE_LEN);
        if (!std::equal(signature, signature + MVEI_FILE_SIGNATURE_LEN,
            MVEI_FILE_SIGNATURE))
            throw util::Exception("Invalid file signature");

        /* Read image headers data, */
        int32_t width, height, channels, raw_type;
        in.read(reinterpret_cast<char*>(&width), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&height), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&channels), sizeof(int32_t));
        in.read(reinterpret_cast<char*>(&raw_type), sizeof(int32_t));

        if (!in.good())
            throw util::Exception("Error reading headers");

        headers->width = width;
        headers->height = height;
        headers->channels = channels;
        headers->type = static_cast<ImageType>(raw_type);
    }